

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O2

void UnaryExpression_delete_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  int iVar1;
  undefined1 local_48 [8];
  int local_40;
  undefined1 local_30 [8];
  JsValue r1;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_30);
  res->type = JS_BOOLEAN;
  iVar1 = 0;
  if (local_30._0_4_ == JS_REFERENCE) {
    if (r1._0_8_ == 0) {
      iVar1 = 1;
    }
    else {
      (**(code **)(r1._0_8_ + 0x40))(r1._0_8_,r1.u.number,local_48);
      iVar1 = local_40;
    }
  }
  (res->u).boolean = iVar1;
  return;
}

Assistant:

static void
UnaryExpression_delete_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1;

	EVAL(n->a, context, &r1);
	UnaryExpression_delete_eval_common(context, &r1, res);
}